

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.h
# Opt level: O0

void __thiscall GrcSymbolTable::GrcSymbolTable(GrcSymbolTable *this,bool fMain)

{
  byte in_SIL;
  undefined8 *in_RDI;
  GrcSymbolTable *in_stack_00000020;
  
  *in_RDI = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GrcSymbolTableEntry_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GrcSymbolTableEntry_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GrcSymbolTableEntry_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GrcSymbolTableEntry_*>_>_>
         *)0x1b8a91);
  *(undefined4 *)(in_RDI + 7) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  if ((in_SIL & 1) != 0) {
    InitWithPreDefined(in_stack_00000020);
  }
  return;
}

Assistant:

GrcSymbolTable(bool fMain)
		:	m_psymParent(NULL),
			m_cLevel(0),
			m_csymAnonClass(0)
	{
		if (fMain)
			InitWithPreDefined();

		//m_staLabelDbg.Assign(""); // DEBUG
	}